

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity)

{
  uint uVar1;
  REF_CELL pRVar2;
  uint uVar3;
  uint local_b4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_34;
  REF_INT seg;
  REF_INT face_node;
  REF_INT face;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_CELL ref_cell;
  REF_CAVITY ref_cavity_local;
  
  pRVar2 = ref_cavity->ref_grid->cell[8];
  for (face = 0; face < ref_cavity->tet_list->n; face = face + 1) {
    uVar1 = ref_cavity->tet_list->value[face];
    uVar3 = ref_cell_nodes(pRVar2,uVar1,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x9d3,"ref_cavity_topo",(ulong)uVar3,"cell");
      return uVar3;
    }
    printf("old tet %d %d %d %d (%d)\n",(ulong)(uint)ref_private_macro_code_rss_1,
           (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
           (ulong)uVar1);
  }
  uVar1 = ref_cavity->node;
  for (seg = 0; seg < ref_cavity->maxface; seg = seg + 1) {
    if (((((-1 < seg) && (seg < ref_cavity->maxface)) && (ref_cavity->f2n[seg * 3] != -1)) &&
        ((uVar1 != ref_cavity->f2n[seg * 3] && (uVar1 != ref_cavity->f2n[seg * 3 + 1])))) &&
       (uVar1 != ref_cavity->f2n[seg * 3 + 2])) {
      printf("new tet ");
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        printf(" %d ",(ulong)(uint)ref_cavity->f2n[local_34 + seg * 3]);
      }
      printf(" %d ",(ulong)uVar1);
      printf(" [%d]\n",(ulong)(uint)seg);
    }
  }
  pRVar2 = ref_cavity->ref_grid->cell[3];
  face = 0;
  while( true ) {
    if (ref_cavity->tri_list->n <= face) {
      if (ref_cavity->surf_node == -1) {
        local_b4 = ref_cavity->node;
      }
      else {
        local_b4 = ref_cavity->surf_node;
      }
      for (nodes[0x1a] = 0; nodes[0x1a] < ref_cavity->maxseg; nodes[0x1a] = nodes[0x1a] + 1) {
        if (((-1 < nodes[0x1a]) && (nodes[0x1a] < ref_cavity->maxseg)) &&
           ((ref_cavity->s2n[nodes[0x1a] * 3] != -1 &&
            ((local_b4 != ref_cavity->s2n[nodes[0x1a] * 3] &&
             (local_b4 != ref_cavity->s2n[nodes[0x1a] * 3 + 1])))))) {
          printf("new tri ");
          printf(" %d ",(ulong)(uint)ref_cavity->s2n[nodes[0x1a] * 3]);
          printf(" %d ",(ulong)(uint)ref_cavity->s2n[nodes[0x1a] * 3 + 1]);
          printf(" %d ",(ulong)local_b4);
          printf(" faceid %d ",(ulong)(uint)ref_cavity->s2n[nodes[0x1a] * 3 + 2]);
          printf(" [%d]\n",(ulong)(uint)nodes[0x1a]);
        }
      }
      return 0;
    }
    uVar1 = ref_cavity->tri_list->value[face];
    uVar3 = ref_cell_nodes(pRVar2,uVar1,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) break;
    printf("old tri %d %d %d faceid %d (%d)\n",(ulong)(uint)ref_private_macro_code_rss_1,
           (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
           (ulong)uVar1);
    face = face + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x9e7,
         "ref_cavity_topo",(ulong)uVar3,"cell");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity) {
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, cell, face, face_node, seg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tet %d %d %d %d (%d)\n", nodes[0], nodes[1], nodes[2], nodes[3],
           cell);
  }

  node = ref_cavity_node(ref_cavity);
  each_ref_cavity_valid_face(ref_cavity, face) {
    if (node == ref_cavity_f2n(ref_cavity, 0, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 1, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 2, face)) continue;
    printf("new tet ");
    for (face_node = 0; face_node < 3; face_node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, face_node, face));
    printf(" %d ", node);
    printf(" [%d]\n", face);
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tri %d %d %d faceid %d (%d)\n", nodes[0], nodes[1], nodes[2],
           nodes[3], cell);
  }

  node = ref_cavity_seg_node(ref_cavity);
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if (node == ref_cavity_s2n(ref_cavity, 0, seg)) continue;
    if (node == ref_cavity_s2n(ref_cavity, 1, seg)) continue;
    printf("new tri ");
    printf(" %d ", ref_cavity_s2n(ref_cavity, 0, seg));
    printf(" %d ", ref_cavity_s2n(ref_cavity, 1, seg));
    printf(" %d ", node);
    printf(" faceid %d ", ref_cavity_s2n(ref_cavity, 2, seg));
    printf(" [%d]\n", seg);
  }

  return REF_SUCCESS;
}